

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivVerify.cpp
# Opt level: O0

void DivVerifyUint64Int64_2(void)

{
  bool bVar1;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si2;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  bool fSuccess;
  TestCase<long,_unsigned_long,_2> test;
  TestVector<long,_unsigned_long,_2> tests;
  unsigned_long local_a8;
  TestVector<long,_unsigned_long,_2> *in_stack_ffffffffffffff60;
  byte local_98;
  unsigned_long in_stack_ffffffffffffff70;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  in_stack_ffffffffffffff78;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_48;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_40;
  byte expected;
  unsigned_long in_stack_ffffffffffffffd0;
  TestVector<long,_unsigned_long,_2> *in_stack_ffffffffffffffd8;
  byte in_stack_ffffffffffffffe0;
  undefined7 in_stack_ffffffffffffffe1;
  TestVector<long,_unsigned_long,_2> local_18;
  
  TestVector<long,_unsigned_long,_2>::TestVector(&local_18);
  TestVector<long,_unsigned_long,_2>::GetNext(in_stack_ffffffffffffff60);
  while( true ) {
    bVar1 = TestVector<long,_unsigned_long,_2>::Done(&local_18);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    expected = 1;
    SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
              (&local_40,(long *)&stack0xffffffffffffffd0);
    SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
              (&local_48);
    local_48 = operator/(in_stack_ffffffffffffff70,in_stack_ffffffffffffff78);
    if ((expected & 1) != (in_stack_ffffffffffffffe0 & 1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffff78,"Error in case int64_uint64_2 throw: ",
                 (allocator *)&stack0xffffffffffffff77);
      err_msg<long,unsigned_long>
                ((string *)CONCAT71(in_stack_ffffffffffffffe1,in_stack_ffffffffffffffe0),
                 (long)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,(bool)expected);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff77);
    }
    TestVector<long,_unsigned_long,_2>::GetNext(in_stack_ffffffffffffff60);
    in_stack_ffffffffffffffd0 = local_a8;
    in_stack_ffffffffffffffd8 = in_stack_ffffffffffffff60;
    in_stack_ffffffffffffffe0 = local_98;
  }
  return;
}

Assistant:

void DivVerifyUint64Int64_2()
{
    TestVector< std::int64_t, std::uint64_t, OpType::Div2 > tests;
    TestCase< std::int64_t, std::uint64_t, OpType::Div2 > test = tests.GetNext();

    while (!tests.Done())
    {
      // Now test throwing version
      bool fSuccess = true;
      try
      {
         SafeInt<std::int64_t> si(test.x);
         SafeInt<std::int64_t> si2;

         si2 = test.y / si;
      }
      catch(...)
      {
         fSuccess = false;
      }

      if( fSuccess != test.fExpected )
      {
          err_msg( "Error in case int64_uint64_2 throw: ", test.x, test.y, test.fExpected );
      }

      test = tests.GetNext();
   }
}